

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<void> __thiscall kj::AsyncCapabilityStream::sendFd(AsyncCapabilityStream *this,int fd)

{
  int *piVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  ArrayPtr<const_int> AVar2;
  undefined4 local_80;
  undefined4 uStack_78;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_70;
  ArrayPtr<const_unsigned_char> local_60;
  Promise<void> promise;
  undefined1 local_38 [8];
  Array<int> fds;
  int fd_local;
  AsyncCapabilityStream *this_local;
  
  fds.disposer._4_4_ = in_EDX;
  heapArray<int>((Array<int> *)local_38,1);
  piVar1 = Array<int>::operator[]((Array<int> *)local_38,0);
  *piVar1 = fds.disposer._4_4_;
  local_60 = arrayPtr<unsigned_char_const>("",1);
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::ArrayPtr(&local_70,(void *)0x0);
  AVar2 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_38);
  local_80 = AVar2.ptr._0_4_;
  uStack_78 = (undefined4)AVar2.size_;
  (**(code **)(*(long *)CONCAT44(in_register_00000034,fd) + 0x70))
            (&stack0xffffffffffffffb0,(long *)CONCAT44(in_register_00000034,fd),local_60.ptr,
             local_60.size_,local_70.ptr,local_70.size_,local_80,uStack_78);
  mv<kj::Array<int>>((Array<int> *)local_38);
  Promise<void>::attach<kj::Array<int>>
            ((Promise<void> *)this,(Array<int> *)&stack0xffffffffffffffb0);
  Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffb0);
  Array<int>::~Array((Array<int> *)local_38);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> AsyncCapabilityStream::sendFd(int fd) {
  static constexpr byte b = 0;
  auto fds = kj::heapArray<int>(1);
  fds[0] = fd;
  auto promise = writeWithFds(arrayPtr(&b, 1), nullptr, fds);
  return promise.attach(kj::mv(fds));
}